

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFOBSFireFightingGraph.cpp
# Opt level: O1

Scope * __thiscall
ProblemFOBSFireFightingGraph::GetHousesAgentInfluences
          (Scope *__return_storage_ptr__,ProblemFOBSFireFightingGraph *this,Index agI)

{
  iterator iVar1;
  Index local_20;
  uint local_1c;
  
  (__return_storage_ptr__->super_SDT).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_SDT).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_SDT).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar1._M_current =
       (__return_storage_ptr__->super_SDT).
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_20 = agI;
  if (iVar1._M_current ==
      (__return_storage_ptr__->super_SDT).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,iVar1,
               &local_20);
  }
  else {
    *iVar1._M_current = agI;
    (__return_storage_ptr__->super_SDT).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  local_1c = agI + 1;
  iVar1._M_current =
       (__return_storage_ptr__->super_SDT).
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (__return_storage_ptr__->super_SDT).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,iVar1,
               &local_1c);
  }
  else {
    *iVar1._M_current = local_1c;
    (__return_storage_ptr__->super_SDT).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Scope ProblemFOBSFireFightingGraph::GetHousesAgentInfluences(Index agI) const
{
    Scope houses;
    // agent's actions only influence two houses
    houses.Insert(agI);
    houses.Insert(agI+1);
    return(houses);
}